

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlRegFreeExecCtxt(xmlRegExecCtxtPtr exec)

{
  void *pvVar1;
  xmlRegExecRollback *pxVar2;
  int i_1;
  long lVar3;
  int i;
  long lVar4;
  
  if (exec != (xmlRegExecCtxtPtr)0x0) {
    pxVar2 = exec->rollbacks;
    if (pxVar2 != (xmlRegExecRollback *)0x0) {
      if (exec->counts != (int *)0x0) {
        lVar3 = 0x10;
        for (lVar4 = 0; pxVar2 = exec->rollbacks, lVar4 < exec->maxRollbacks; lVar4 = lVar4 + 1) {
          pvVar1 = *(void **)((long)&pxVar2->state + lVar3);
          if (pvVar1 != (void *)0x0) {
            (*xmlFree)(pvVar1);
          }
          lVar3 = lVar3 + 0x18;
        }
      }
      (*xmlFree)(pxVar2);
    }
    if (exec->counts != (int *)0x0) {
      (*xmlFree)(exec->counts);
    }
    if (exec->inputStack != (xmlRegInputTokenPtr)0x0) {
      lVar4 = 0;
      for (lVar3 = 0; lVar3 < exec->inputStackNr; lVar3 = lVar3 + 1) {
        pvVar1 = *(void **)((long)&exec->inputStack->value + lVar4);
        if (pvVar1 != (void *)0x0) {
          (*xmlFree)(pvVar1);
        }
        lVar4 = lVar4 + 0x10;
      }
      (*xmlFree)(exec->inputStack);
    }
    if (exec->errString != (xmlChar *)0x0) {
      (*xmlFree)(exec->errString);
    }
    (*xmlFree)(exec);
    return;
  }
  return;
}

Assistant:

void
xmlRegFreeExecCtxt(xmlRegExecCtxtPtr exec) {
    if (exec == NULL)
	return;

    if (exec->rollbacks != NULL) {
	if (exec->counts != NULL) {
	    int i;

	    for (i = 0;i < exec->maxRollbacks;i++)
		if (exec->rollbacks[i].counts != NULL)
		    xmlFree(exec->rollbacks[i].counts);
	}
	xmlFree(exec->rollbacks);
    }
    if (exec->counts != NULL)
	xmlFree(exec->counts);
    if (exec->inputStack != NULL) {
	int i;

	for (i = 0;i < exec->inputStackNr;i++) {
	    if (exec->inputStack[i].value != NULL)
		xmlFree(exec->inputStack[i].value);
	}
	xmlFree(exec->inputStack);
    }
    if (exec->errString != NULL)
        xmlFree(exec->errString);
    xmlFree(exec);
}